

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t despace_avx2_vpermd(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  ulong uVar5;
  undefined1 auVar6 [32];
  long lVar7;
  size_t sVar8;
  long lVar9;
  undefined8 *dst_void_00;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar10 [32];
  
  auVar6 = _DAT_001952a0;
  auVar12[8] = 0x70;
  auVar12._0_8_ = 0x7070707070707070;
  auVar12[9] = 0x70;
  auVar12[10] = 0x70;
  auVar12[0xb] = 0x70;
  auVar12[0xc] = 0x70;
  auVar12[0xd] = 0x70;
  auVar12[0xe] = 0x70;
  auVar12[0xf] = 0x70;
  auVar12[0x10] = 0x70;
  auVar12[0x11] = 0x70;
  auVar12[0x12] = 0x70;
  auVar12[0x13] = 0x70;
  auVar12[0x14] = 0x70;
  auVar12[0x15] = 0x70;
  auVar12[0x16] = 0x70;
  auVar12[0x17] = 0x70;
  auVar12[0x18] = 0x70;
  auVar12[0x19] = 0x70;
  auVar12[0x1a] = 0x70;
  auVar12[0x1b] = 0x70;
  auVar12[0x1c] = 0x70;
  auVar12[0x1d] = 0x70;
  auVar12[0x1e] = 0x70;
  auVar12[0x1f] = 0x70;
  auVar13[8] = 0x20;
  auVar13._0_8_ = 0x2020202020202020;
  auVar13[9] = 0x20;
  auVar13[10] = 0x20;
  auVar13[0xb] = 0x20;
  auVar13[0xc] = 0x20;
  auVar13[0xd] = 0x20;
  auVar13[0xe] = 0x20;
  auVar13[0xf] = 0x20;
  auVar13[0x10] = 0x20;
  auVar13[0x11] = 0x20;
  auVar13[0x12] = 0x20;
  auVar13[0x13] = 0x20;
  auVar13[0x14] = 0x20;
  auVar13[0x15] = 0x20;
  auVar13[0x16] = 0x20;
  auVar13[0x17] = 0x20;
  auVar13[0x18] = 0x20;
  auVar13[0x19] = 0x20;
  auVar13[0x1a] = 0x20;
  auVar13[0x1b] = 0x20;
  auVar13[0x1c] = 0x20;
  auVar13[0x1d] = 0x20;
  auVar13[0x1e] = 0x20;
  auVar13[0x1f] = 0x20;
  auVar14._16_16_ = _DAT_001951b0;
  auVar14._0_16_ = _DAT_001951b0;
  auVar15._8_8_ = 0x80a0908884828180;
  auVar15._0_8_ = 0x80a0908884828180;
  auVar15._16_8_ = 0x80a0908884828180;
  auVar15._24_8_ = 0x80a0908884828180;
  auVar16._8_8_ = 0x20100800000000;
  auVar16._0_8_ = 0x20100800000000;
  auVar16._16_8_ = 0x20100800000000;
  auVar16._24_8_ = 0x20100800000000;
  auVar17._8_8_ = 0x8080808;
  auVar17._0_8_ = 0x8080808;
  auVar17._16_8_ = 0x8080808;
  auVar17._24_8_ = 0x8080808;
  auVar18._16_16_ = _DAT_001951d0;
  auVar18._0_16_ = _DAT_001951d0;
  auVar4 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
  dst_void_00 = (undefined8 *)dst_void;
  while (0x1f < length) {
    auVar1 = *src_void;
    src_void = (void *)((long)src_void + 0x20);
    length = length - 0x20;
    auVar19 = vpaddusb_avx2(auVar1,auVar12);
    uVar5 = vpcmpeqb_avx512vl(auVar1,auVar13);
    auVar19 = vpshufb_avx2(auVar14,auVar19);
    auVar10 = vmovdqu8_avx512vl(auVar4);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar11[0] = bVar3 * auVar10[0] | !bVar3 * auVar19[0];
    bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar11[1] = bVar3 * auVar10[1] | !bVar3 * auVar19[1];
    bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar11[2] = bVar3 * auVar10[2] | !bVar3 * auVar19[2];
    bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar11[3] = bVar3 * auVar10[3] | !bVar3 * auVar19[3];
    bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar11[4] = bVar3 * auVar10[4] | !bVar3 * auVar19[4];
    bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar11[5] = bVar3 * auVar10[5] | !bVar3 * auVar19[5];
    bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar11[6] = bVar3 * auVar10[6] | !bVar3 * auVar19[6];
    bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
    auVar11[7] = bVar3 * auVar10[7] | !bVar3 * auVar19[7];
    bVar3 = (bool)((byte)(uVar5 >> 8) & 1);
    auVar11[8] = bVar3 * auVar10[8] | !bVar3 * auVar19[8];
    bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
    auVar11[9] = bVar3 * auVar10[9] | !bVar3 * auVar19[9];
    bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
    auVar11[10] = bVar3 * auVar10[10] | !bVar3 * auVar19[10];
    bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
    auVar11[0xb] = bVar3 * auVar10[0xb] | !bVar3 * auVar19[0xb];
    bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
    auVar11[0xc] = bVar3 * auVar10[0xc] | !bVar3 * auVar19[0xc];
    bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
    auVar11[0xd] = bVar3 * auVar10[0xd] | !bVar3 * auVar19[0xd];
    bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
    auVar11[0xe] = bVar3 * auVar10[0xe] | !bVar3 * auVar19[0xe];
    bVar3 = (bool)((byte)(uVar5 >> 0xf) & 1);
    auVar11[0xf] = bVar3 * auVar10[0xf] | !bVar3 * auVar19[0xf];
    bVar3 = (bool)((byte)(uVar5 >> 0x10) & 1);
    auVar11[0x10] = bVar3 * auVar10[0x10] | !bVar3 * auVar19[0x10];
    bVar3 = (bool)((byte)(uVar5 >> 0x11) & 1);
    auVar11[0x11] = bVar3 * auVar10[0x11] | !bVar3 * auVar19[0x11];
    bVar3 = (bool)((byte)(uVar5 >> 0x12) & 1);
    auVar11[0x12] = bVar3 * auVar10[0x12] | !bVar3 * auVar19[0x12];
    bVar3 = (bool)((byte)(uVar5 >> 0x13) & 1);
    auVar11[0x13] = bVar3 * auVar10[0x13] | !bVar3 * auVar19[0x13];
    bVar3 = (bool)((byte)(uVar5 >> 0x14) & 1);
    auVar11[0x14] = bVar3 * auVar10[0x14] | !bVar3 * auVar19[0x14];
    bVar3 = (bool)((byte)(uVar5 >> 0x15) & 1);
    auVar11[0x15] = bVar3 * auVar10[0x15] | !bVar3 * auVar19[0x15];
    bVar3 = (bool)((byte)(uVar5 >> 0x16) & 1);
    auVar11[0x16] = bVar3 * auVar10[0x16] | !bVar3 * auVar19[0x16];
    bVar3 = (bool)((byte)(uVar5 >> 0x17) & 1);
    auVar11[0x17] = bVar3 * auVar10[0x17] | !bVar3 * auVar19[0x17];
    bVar3 = (bool)((byte)(uVar5 >> 0x18) & 1);
    auVar11[0x18] = bVar3 * auVar10[0x18] | !bVar3 * auVar19[0x18];
    bVar3 = (bool)((byte)(uVar5 >> 0x19) & 1);
    auVar11[0x19] = bVar3 * auVar10[0x19] | !bVar3 * auVar19[0x19];
    bVar3 = (bool)((byte)(uVar5 >> 0x1a) & 1);
    auVar11[0x1a] = bVar3 * auVar10[0x1a] | !bVar3 * auVar19[0x1a];
    bVar3 = (bool)((byte)(uVar5 >> 0x1b) & 1);
    auVar11[0x1b] = bVar3 * auVar10[0x1b] | !bVar3 * auVar19[0x1b];
    bVar3 = (bool)((byte)(uVar5 >> 0x1c) & 1);
    auVar11[0x1c] = bVar3 * auVar10[0x1c] | !bVar3 * auVar19[0x1c];
    bVar3 = (bool)((byte)(uVar5 >> 0x1d) & 1);
    auVar11._30_2_ = auVar10._30_2_;
    auVar11[0x1d] = bVar3 * auVar10[0x1d] | !bVar3 * auVar19[0x1d];
    auVar10 = vpandn_avx2(auVar11,auVar15);
    auVar19 = vpand_avx2(auVar11,auVar17);
    auVar10 = vpsadbw_avx2(auVar10,auVar16);
    auVar11 = vpsadbw_avx2(auVar19,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar19 = vpsllq_avx2(auVar10,0x1d);
    auVar21 = vpsrlq_avx2(auVar10,7);
    auVar19 = vpor_avx2(auVar19,auVar10);
    lVar20 = auVar21._0_8_;
    auVar19 = vpermd_avx2(auVar19,auVar6);
    auVar19 = vpsrlvq_avx2(auVar19 ^ auVar18,auVar11);
    auVar1 = vpshufb_avx2(auVar1,auVar19);
    *dst_void_00 = auVar1._0_8_;
    uVar2 = vpextrq_avx(auVar1._0_16_,1);
    *(undefined8 *)((long)dst_void_00 + lVar20) = uVar2;
    lVar7 = vpextrq_avx(auVar21._0_16_,1);
    lVar9 = vpextrq_avx(auVar21._16_16_,1);
    *(long *)((long)dst_void_00 + lVar7 + lVar20) = auVar1._16_8_;
    uVar2 = vpextrq_avx(auVar1._16_16_,1);
    *(undefined8 *)((long)dst_void_00 + auVar21._16_8_ + lVar7 + lVar20) = uVar2;
    dst_void_00 = (undefined8 *)((long)dst_void_00 + lVar9 + auVar21._16_8_ + lVar7 + lVar20);
  }
  sVar8 = despace_branchless(dst_void_00,src_void,length);
  return (long)dst_void_00 + (sVar8 - (long)dst_void);
}

Assistant:

size_t despace_avx2_vpermd( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m256i mask_20  = _mm256_set1_epi8( 0x20 );
	const __m256i mask_70  = _mm256_set1_epi8( 0x70 );
	const __m256i lut_cntrl = _mm256_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00,
		//
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00
	);

	const __m256i mask_index = _mm256_set1_epi64x( 0x80A0908884828180 );
	const __m256i mask_shift = _mm256_set1_epi64x( 0x0000000008080808 );
	const __m256i mask_invert = _mm256_set1_epi64x( 0x0020100800000000 );
	const __m256i mask_fixup = _mm256_set_epi32(
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707,
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707
	);
	const __m256i lut = _mm256_set_epi32(
		0x04050607, // 0x03020100', 0x000000'07
		0x04050704, // 0x030200'00, 0x0000'0704
		0x04060705, // 0x030100'00, 0x0000'0705
		0x04070504, // 0x0300'0000, 0x00'070504
		0x05060706, // 0x020100'00, 0x0000'0706
		0x05070604, // 0x0200'0000, 0x00'070604
		0x06070605, // 0x0100'0000, 0x00'070605
		0x07060504  // 0x00'000000, 0x'07060504
	);

	for( ; length >= 32; length-=32 ){
		__m256i r0,r1,r2,r3,r4;

		r0 = _mm256_loadu_si256((__m256i *)src); // asrc
		src += 32;

		r1 = _mm256_adds_epu8(mask_70, r0);
		r2 = _mm256_cmpeq_epi8(mask_20, r0);
		r1 = _mm256_shuffle_epi8(lut_cntrl, r1);
		r1 = _mm256_or_si256(r1, r2); // bytemask of spaces

		r2 = _mm256_andnot_si256(r1, mask_index);
		r1 = _mm256_and_si256(r1, mask_shift);
		r2 = _mm256_sad_epu8(r2, mask_invert); // bitmap[0:5], popcnt[7:15]
		r1 = _mm256_sad_epu8(r1, _mm256_setzero_si256()); // shift amount
		r3 = _mm256_slli_epi64(r2, 29); // move hi index to 2nd dword
		r4 = _mm256_srli_epi64(r2, 7); // popcnt
		r2 = _mm256_or_si256(r2, r3);
		r2 = _mm256_permutevar8x32_epi32(lut, r2);
		r2 = _mm256_xor_si256(r2, mask_fixup);
		r2 = _mm256_srlv_epi64(r2, r1);
		r0 = _mm256_shuffle_epi8(r0, r2);

		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 0);
		dst += _mm256_extract_epi64(r4, 0);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 1);
		dst += _mm256_extract_epi64(r4, 1);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 2);
		dst += _mm256_extract_epi64(r4, 2);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 3);
		dst += _mm256_extract_epi64(r4, 3);
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}